

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O1

int CfdGetPsbtRecord(void *handle,void *psbt_handle,int type,uint32_t index,char *key,char **value)

{
  pointer puVar1;
  bool bVar2;
  char *pcVar3;
  CfdException *pCVar4;
  ByteData key_data;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  int local_6c;
  ByteData local_68;
  ByteData local_48;
  
  local_6c = type;
  cfd::Initialize();
  local_98._0_8_ = &local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"PsbtHandle","");
  cfd::capi::CheckBuffer(psbt_handle,(string *)local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &local_88) {
    operator_delete((void *)local_98._0_8_);
  }
  bVar2 = cfd::capi::IsEmptyString(key);
  if (bVar2) {
    local_98._0_8_ = "cfdcapi_psbt.cpp";
    local_98._8_4_ = 0x8f1;
    local_88._M_allocated_capacity = 0x5f61f4;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"key is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_98._0_8_ = &local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"Failed to parameter. key is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_98);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (value == (char **)0x0) {
    local_98._0_8_ = "cfdcapi_psbt.cpp";
    local_98._8_4_ = 0x8f7;
    local_88._M_allocated_capacity = 0x5f61f4;
    cfd::core::logger::log<>((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"value is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_98._0_8_ = &local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"Failed to parameter. value is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_98);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)((long)psbt_handle + 0x18) != 0) {
    std::__cxx11::string::string((string *)local_98,key,(allocator *)&local_68);
    cfd::core::ByteData::ByteData(&local_48,(string *)local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._0_8_ != &local_88) {
      operator_delete((void *)local_98._0_8_);
    }
    cfd::core::ByteData::ByteData(&local_68);
    if (local_6c == 1) {
      cfd::core::Psbt::GetGlobalRecord
                ((ByteData *)local_98,*(Psbt **)((long)psbt_handle + 0x18),&local_48);
    }
    else if (local_6c == 2) {
      cfd::core::Psbt::GetTxInRecord
                ((ByteData *)local_98,*(Psbt **)((long)psbt_handle + 0x18),index,&local_48);
    }
    else {
      if (local_6c != 3) {
        local_98._0_8_ = "cfdcapi_psbt.cpp";
        local_98._8_4_ = 0x910;
        local_88._M_allocated_capacity = 0x5f61f4;
        cfd::core::logger::log<int&>
                  ((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"type is invalid: {}",&local_6c
                  );
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        local_98._0_8_ = &local_88;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_98,"Failed to parameter. type is invalid.","");
        cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_98);
        __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
      cfd::core::Psbt::GetTxOutRecord
                ((ByteData *)local_98,*(Psbt **)((long)psbt_handle + 0x18),index,&local_48);
    }
    puVar1 = local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_98._0_8_;
    local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_98._8_8_;
    local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_88._M_allocated_capacity;
    local_98._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_98._8_8_ = (pointer)0x0;
    local_88._M_allocated_capacity = 0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_98._0_8_);
    }
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_98,&local_68);
    pcVar3 = cfd::capi::CreateString((string *)local_98);
    *value = pcVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._0_8_ != &local_88) {
      operator_delete((void *)local_98._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_68.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
  local_98._0_8_ = "cfdcapi_psbt.cpp";
  local_98._8_4_ = 0x8fd;
  local_88._M_allocated_capacity = 0x5f61f4;
  cfd::core::logger::log<>((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"psbt is null.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_98._0_8_ = &local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"Failed to handle statement. psbt is null.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_98);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPsbtRecord(
    void* handle, void* psbt_handle, int type, uint32_t index, const char* key,
    char** value) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(key)) {
      warn(CFD_LOG_SOURCE, "key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. key is null or empty.");
    }
    if (value == nullptr) {
      warn(CFD_LOG_SOURCE, "value is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. value is null.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    ByteData key_data(key);
    ByteData data;
    switch (type) {
      case kCfdPsbtRecordTypeGlobal:
        data = psbt_obj->psbt->GetGlobalRecord(key_data);
        break;
      case kCfdPsbtRecordTypeInput:
        data = psbt_obj->psbt->GetTxInRecord(index, key_data);
        break;
      case kCfdPsbtRecordTypeOutput:
        data = psbt_obj->psbt->GetTxOutRecord(index, key_data);
        break;
      default:
        warn(CFD_LOG_SOURCE, "type is invalid: {}", type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. type is invalid.");
    }

    *value = CreateString(data.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}